

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::ProfiledNewScIntArray<true>
          (InterpreterStackFrame *this,OpLayoutDynamicProfile<Js::OpLayoutAuxiliary> *playout)

{
  ProfileId index;
  uint uVar1;
  FunctionBody *this_00;
  JavascriptLibrary *lib;
  Recycler *recycler;
  code *pcVar2;
  bool bVar3;
  AuxArray<int> *ints;
  DynamicProfileInfo *this_01;
  ArrayCallSiteInfo *arrayInfo;
  JavascriptNativeArray *this_02;
  undefined4 *puVar4;
  RecyclerWeakReferenceBase *weakRef;
  ulong uVar5;
  ulong uVar6;
  SparseArraySegmentBase *pSVar7;
  
  ints = ByteCodeReader::ReadAuxArray<int>
                   ((playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset,
                    *(FunctionBody **)(this + 0x88));
  index = playout->profileId;
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  arrayInfo = DynamicProfileInfo::GetArrayCallSiteInfo(this_01,this_00,index);
  if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1526,"(arrayInfo)","arrayInfo");
    if (!bVar3) {
LAB_00a6b57b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
LAB_00a6b3e8:
    this_02 = (JavascriptNativeArray *)
              JavascriptLibrary::CreateArrayLiteral
                        (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count);
    if (ints->count != 0) {
      pSVar7 = (this_02->super_JavascriptArray).head.ptr + 1;
      uVar5 = 0;
      do {
        uVar6 = (ulong)ints[uVar5 + 1].count | 0x1000000000000;
        Memory::Recycler::WBSetBit((char *)pSVar7);
        pSVar7->left = (int)uVar6;
        pSVar7->length = (int)(uVar6 >> 0x20);
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar7);
        uVar5 = uVar5 + 1;
        pSVar7 = (SparseArraySegmentBase *)&pSVar7->size;
      } while (uVar5 < ints->count);
    }
  }
  else {
    if ((((arrayInfo->field_0).bits & 1) != 0) ||
       (bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar3)) {
      if (((arrayInfo == (ArrayCallSiteInfo *)0x0) || (((arrayInfo->field_0).bits & 2) != 0)) ||
         (bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar3))
      goto LAB_00a6b3e8;
      this_02 = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                           (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count)->
                 super_JavascriptNativeArray;
      uVar1 = ints->count;
      if ((ulong)uVar1 != 0) {
        pSVar7 = (((JavascriptNativeArray *)&this_02->super_JavascriptArray)->super_JavascriptArray)
                 .head.ptr;
        uVar5 = 0;
        do {
          *(double *)(&pSVar7[1].left + uVar5 * 2) = (double)(int)ints[uVar5 + 1].count;
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
    }
    else {
      lib = *(JavascriptLibrary **)(*(long *)(this + 0x78) + 8);
      bVar3 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib,arrayInfo,ints->count);
      if (bVar3) {
        if ((lib->cacheForCopyOnAccessArraySegments).ptr == (CacheForCopyOnAccessArraySegments *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                      ,0x1530,"(lib->cacheForCopyOnAccessArraySegments)",
                                      "lib->cacheForCopyOnAccessArraySegments");
          if (!bVar3) goto LAB_00a6b57b;
          *puVar4 = 0;
        }
        this_02 = &JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                             (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),arrayInfo,this_00,
                              ints)->super_JavascriptNativeArray;
      }
      else {
        this_02 = &JavascriptLibrary::CreateNativeIntArrayLiteral
                             (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count)->
                   super_JavascriptNativeArray;
        JavascriptOperators::AddIntsToArraySegment
                  ((SparseArraySegment<int> *)
                   (((JavascriptNativeArray *)&this_02->super_JavascriptArray)->
                   super_JavascriptArray).head.ptr,ints);
      }
    }
    recycler = *(Recycler **)(*(long *)(this + 0x78) + 0x1200);
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&recycler->weakReferenceMap,(char *)this_00,recycler);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&FunctionBody::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
    }
    JavascriptNativeArray::SetArrayCallSite
              (this_02,index,(RecyclerWeakReference<Js::FunctionBody> *)weakRef);
  }
  JavascriptArray::CheckForceES5Array(&this_02->super_JavascriptArray);
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,this_02);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledNewScIntArray(const unaligned OpLayoutDynamicProfile<OpLayoutAuxiliary> * playout)
    {
        if (!Profiled && !isAutoProfiling)
        {
            OP_NewScIntArray(playout);
            return;
        }

        const Js::AuxArray<int32> *ints = Js::ByteCodeReader::ReadAuxArray<int32>(playout->Offset, this->GetFunctionBody());

        Js::ProfileId profileId = playout->profileId;
        FunctionBody *functionBody = this->m_functionBody;
        ArrayCallSiteInfo *arrayInfo = functionBody->GetDynamicProfileInfo()->GetArrayCallSiteInfo(functionBody, profileId);
        Assert(arrayInfo);

        JavascriptArray *arr;
        if (arrayInfo && arrayInfo->IsNativeIntArray())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, ints->count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(ints->count);
                SparseArraySegment<int32> *segment = (SparseArraySegment<int32>*)arr->GetHead();
                JavascriptOperators::AddIntsToArraySegment(segment, ints);
            }

            JavascriptNativeIntArray *intArray = reinterpret_cast<JavascriptNativeIntArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            intArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else if (arrayInfo && arrayInfo->IsNativeFloatArray())
        {
            arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(ints->count);
            SparseArraySegment<double> * segment = (SparseArraySegment<double>*)arr->GetHead();
            for (uint i = 0; i < ints->count; i++)
            {
                segment->elements[i] = (double)ints->elements[i];
            }

            JavascriptNativeFloatArray *floatArray = reinterpret_cast<JavascriptNativeFloatArray*>(arr);
            Recycler *recycler = scriptContext->GetRecycler();
            floatArray->SetArrayCallSite(profileId, recycler->CreateWeakReferenceHandle(functionBody));
        }
        else
        {
            arr = scriptContext->GetLibrary()->CreateArrayLiteral(ints->count);
            SparseArraySegment<Var> * segment = (SparseArraySegment<Var>*)arr->GetHead();
            for (uint i = 0; i < ints->count; i++)
            {
                segment->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
            }
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }